

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_internal.c
# Opt level: O1

void stretch_image(uint32_t *srcImage,uint32_t srcX,uint32_t srcY,uint32_t srcWidth,
                  uint32_t srcHeight,uint32_t srcPitch,uint32_t *dstImage,uint32_t dstX,
                  uint32_t dstY,uint32_t dstWidth,uint32_t dstHeight,uint32_t dstPitch)

{
  uint uVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (dstImage != (uint32_t *)0x0 && srcImage != (uint32_t *)0x0) {
    puVar3 = srcImage + (srcY * srcPitch + srcX);
    puVar4 = dstImage + (dstY * dstPitch + dstX);
    uVar5 = 0;
    iVar2 = 0;
    do {
      uVar7 = 0;
      uVar8 = 0;
      do {
        puVar4[uVar7] = puVar3[uVar8 >> 0x10];
        uVar8 = (ulong)((int)uVar8 + (srcWidth << 0x10) / dstWidth);
        uVar7 = uVar7 + 1;
      } while (dstWidth + (dstWidth == 0) != uVar7);
      uVar6 = uVar5 + (srcHeight << 0x10) / dstHeight;
      uVar5 = uVar6 & 0xffff;
      uVar1 = (uVar6 >> 0x10) * srcPitch;
      if (uVar6 < 0x10000) {
        uVar1 = 0;
      }
      puVar3 = puVar3 + uVar1;
      iVar2 = iVar2 + 1;
      puVar4 = puVar4 + dstPitch;
    } while (iVar2 != dstHeight + (dstHeight == 0));
  }
  return;
}

Assistant:

void
stretch_image(uint32_t *srcImage, uint32_t srcX, uint32_t srcY, uint32_t srcWidth, uint32_t srcHeight, uint32_t srcPitch,
              uint32_t *dstImage, uint32_t dstX, uint32_t dstY, uint32_t dstWidth, uint32_t dstHeight, uint32_t dstPitch) {

    uint32_t    x, y;
    uint32_t    srcOffsetX, srcOffsetY;

    if(srcImage == 0x0 || dstImage == 0x0)
        return;

    srcImage += srcX + srcY * srcPitch;
    dstImage += dstX + dstY * dstPitch;

    const uint32_t deltaX = (srcWidth  << 16) / dstWidth;
    const uint32_t deltaY = (srcHeight << 16) / dstHeight;

    srcOffsetY = 0;
    for(y=0; y<dstHeight; ++y) {
        srcOffsetX = 0;
        for(x=0; x<dstWidth; ++x) {
#if defined(kUseBilinearInterpolation)
            dstImage[x] = interpolate(srcImage, x+srcX, y+srcY, srcOffsetX, srcOffsetY, srcWidth, srcHeight, srcPitch);
#else
            dstImage[x] = srcImage[srcOffsetX >> 16];
#endif
            srcOffsetX += deltaX;
        }

        srcOffsetY += deltaY;
        if(srcOffsetY >= 0x10000) {
            srcImage += (srcOffsetY >> 16) * srcPitch;
            srcOffsetY &= 0xffff;
        }
        dstImage += dstPitch;
    }
}